

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

void remove_bad_spells(monster *mon,bitflag *f)

{
  bool bVar1;
  _Bool _Var2;
  uint32_t uVar3;
  element_info local_a8;
  _Bool know_something;
  element_info el [25];
  bitflag local_38 [3];
  bitflag local_35 [5];
  bitflag ai_pflags [3];
  bitflag ai_flags [5];
  size_t i;
  wchar_t tdist;
  bitflag f2 [12];
  bitflag *f_local;
  monster *mon_local;
  
  f2._4_8_ = f;
  monster_get_target_dist_grid(mon,(int *)&i,(loc_conflict *)0x0);
  flag_copy((bitflag *)((long)&i + 4),(bitflag *)f2._4_8_,0xc);
  if (mon->maxhp <= mon->hp) {
    flag_off((bitflag *)((long)&i + 4),0xc,0x40);
  }
  _Var2 = flag_has_dbg((bitflag *)((long)&i + 4),0xc,0x41,"f2","RSF_HEAL_KIN");
  if ((_Var2) && (_Var2 = find_any_nearby_injured_kin((chunk *)cave,mon), !_Var2)) {
    flag_off((bitflag *)((long)&i + 4),0xc,0x41);
  }
  if (10 < mon->m_timed[5]) {
    flag_off((bitflag *)((long)&i + 4),0xc,0x3f);
  }
  if ((int)i == 1) {
    flag_off((bitflag *)((long)&i + 4),0xc,0x44);
    flag_off((bitflag *)((long)&i + 4),0xc,0x45);
  }
  if (2 < (int)i) {
    flag_off((bitflag *)((long)&i + 4),0xc,2);
  }
  if (3 < (int)i) {
    flag_off((bitflag *)((long)&i + 4),0xc,3);
  }
  if (((player->opts).opt[0x28] & 1U) != 0) {
    bVar1 = false;
    uVar3 = Rand_div(0x14);
    if (uVar3 == 0) {
      flag_wipe((mon->known_pstate).flags,5);
      flag_wipe((mon->known_pstate).pflags,3);
      for (_ai_pflags = 0; _ai_pflags < 0x19; _ai_pflags = _ai_pflags + 1) {
        (mon->known_pstate).el_info[_ai_pflags].res_level = 0;
      }
    }
    flag_wipe(local_35,5);
    flag_wipe(local_38,3);
    flag_copy(local_35,(mon->known_pstate).flags,5);
    flag_copy(local_38,(mon->known_pstate).pflags,3);
    _Var2 = flag_is_empty(local_35,5);
    if ((!_Var2) || (_Var2 = flag_is_empty(local_38,3), !_Var2)) {
      bVar1 = true;
    }
    for (_ai_pflags = 0; _ai_pflags < 0x19; _ai_pflags = _ai_pflags + 1) {
      (&local_a8)[_ai_pflags].res_level = (mon->known_pstate).el_info[_ai_pflags].res_level;
      if ((&local_a8)[_ai_pflags].res_level != 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      unset_spells((bitflag *)((long)&i + 4),local_35,local_38,&local_a8,mon);
    }
  }
  flag_copy((bitflag *)f2._4_8_,(bitflag *)((long)&i + 4),0xc);
  return;
}

Assistant:

static void remove_bad_spells(struct monster *mon, bitflag f[RSF_SIZE])
{
	bitflag f2[RSF_SIZE];
	int tdist;

	monster_get_target_dist_grid(mon, &tdist, NULL);

	/* Take working copy of spell flags */
	rsf_copy(f2, f);

	/* Don't heal if full */
	if (mon->hp >= mon->maxhp) {
		rsf_off(f2, RSF_HEAL);
	}

	/* Don't heal others if no injuries */
	if (rsf_has(f2, RSF_HEAL_KIN) && !find_any_nearby_injured_kin(cave, mon)) {
		rsf_off(f2, RSF_HEAL_KIN);
	}

	/* Don't haste if hasted with time remaining */
	if (mon->m_timed[MON_TMD_FAST] > 10) {
		rsf_off(f2, RSF_HASTE);
	}

	/* Don't teleport to if the player is already next to us */
	if (tdist == 1) {
		rsf_off(f2, RSF_TELE_TO);
		rsf_off(f2, RSF_TELE_SELF_TO);
	}

	/* Don't use the lash effect if the player is too far away */
	if (tdist > 2) {
		rsf_off(f2, RSF_WHIP);
	}
	if (tdist > 3) {
		rsf_off(f2, RSF_SPIT);
	}

	/* Update acquired knowledge */
	if (OPT(player, birth_ai_learn)) {
		size_t i;
		bitflag ai_flags[OF_SIZE], ai_pflags[PF_SIZE];
		struct element_info el[ELEM_MAX];
		bool know_something = false;

		/* Occasionally forget player status */
		if (one_in_(20)) {
			of_wipe(mon->known_pstate.flags);
			pf_wipe(mon->known_pstate.pflags);
			for (i = 0; i < ELEM_MAX; i++)
				mon->known_pstate.el_info[i].res_level = 0;
		}

		/* Use the memorized info */
		of_wipe(ai_flags);
		pf_wipe(ai_pflags);
		of_copy(ai_flags, mon->known_pstate.flags);
		pf_copy(ai_pflags, mon->known_pstate.pflags);
		if (!of_is_empty(ai_flags) || !pf_is_empty(ai_pflags)) {
			know_something = true;
		}

		for (i = 0; i < ELEM_MAX; i++) {
			el[i].res_level = mon->known_pstate.el_info[i].res_level;
			if (el[i].res_level != 0) {
				know_something = true;
			}
		}

		/* Cancel out certain flags based on knowledge */
		if (know_something) {
			unset_spells(f2, ai_flags, ai_pflags, el, mon);
		}
	}

	/* Use working copy of spell flags */
	rsf_copy(f, f2);
}